

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall CLI::RequiredError::RequiredError(RequiredError *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *name_local;
  RequiredError *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  ::std::operator+(&local_38,name," is required");
  RequiredError(this,&local_38,RequiredError);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

RequiredError(std::string name) : RequiredError(name + " is required", ExitCodes::RequiredError) {}